

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerKeepAlive.cpp
# Opt level: O2

void __thiscall
ki::protocol::control::ServerKeepAlive::read_from(ServerKeepAlive *this,istream *istream)

{
  Field<int> *pFVar1;
  string sStack_248;
  string local_228 [2];
  Record record;
  ostringstream oss;
  
  ki::dml::Record::Record(&record);
  std::__cxx11::string::string((string *)local_228,"m_session_id",(allocator *)&oss);
  ki::dml::Record::add_field<unsigned_short>(&record,local_228,true);
  std::__cxx11::string::~string((string *)local_228);
  std::__cxx11::string::string((string *)&sStack_248,"m_timestamp",(allocator *)&oss);
  pFVar1 = ki::dml::Record::add_field<int>(&record,&sStack_248,true);
  std::__cxx11::string::~string((string *)&sStack_248);
  ki::dml::Record::read_from(&record,istream);
  this->m_timestamp = pFVar1->m_value;
  ki::dml::Record::~Record(&record);
  return;
}

Assistant:

void ServerKeepAlive::read_from(std::istream& istream)
	{
		dml::Record record;
		record.add_field<dml::USHRT>("m_session_id");
		auto *timestamp = record.add_field<dml::INT>("m_timestamp");
		try
		{
			record.read_from(istream);
		}
		catch (dml::parse_error &e)
		{
			std::ostringstream oss;
			oss << "Error reading ServerKeepAlive payload: " << e.what();
			throw parse_error(oss.str(), parse_error::INVALID_MESSAGE_DATA);
		}

		m_timestamp = timestamp->get_value();
	}